

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_SHA2_512.c
# Opt level: O0

void Hacl_SHA2_512_hash(uint8_t *hash1,uint8_t *input,uint32_t len)

{
  uint32_t in_stack_00000554;
  uint8_t *in_stack_00000558;
  uint8_t *in_stack_00000560;
  
  Hacl_Impl_SHA2_512_hash(in_stack_00000560,in_stack_00000558,in_stack_00000554);
  return;
}

Assistant:

void Hacl_SHA2_512_hash(uint8_t *hash1, uint8_t *input, uint32_t len)
{
  Hacl_Impl_SHA2_512_hash(hash1, input, len);
}